

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O2

bool __thiscall
Mapper::canMapLabel(Mapper *this,string *label,uint instructionIndex,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *labelMap,
                   vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  out_of_range anon_var_0;
  
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)labelMap,label);
  uVar1 = *pmVar4;
  bVar3 = true;
  if (uVar1 != instructionIndex) {
    if (instructionIndex < uVar1) {
      uVar6 = (long)(int)instructionIndex - 1;
      uVar5 = (long)(int)instructionIndex << 6 | 0x30;
      do {
        uVar6 = uVar6 + 1;
        bVar3 = uVar1 <= uVar6;
        if (uVar1 <= uVar6) {
          return bVar3;
        }
        lVar2 = uVar5 - 0x20;
        uVar5 = uVar5 + 0x40;
      } while (*(int *)(((instructions->
                         super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>
                         )._M_impl.super__Vector_impl_data._M_start)->bytecode + lVar2) != 0);
    }
    else {
      iVar7 = instructionIndex - 1;
      do {
        uVar6 = (ulong)iVar7;
        bVar3 = iVar7 < 1 || uVar6 < uVar1;
        if (bVar3) {
          return bVar3;
        }
        iVar7 = iVar7 + -1;
      } while ((instructions->
               super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar6].length != 0);
    }
  }
  return bVar3;
}

Assistant:

bool Mapper::canMapLabel(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> instructions) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return false;
	}
	if (labelIndex == instructionIndex) {
		return true;
	}
	if (labelIndex > instructionIndex) {
		for (int i = instructionIndex; i < labelIndex; i++) {
			if (!instructions[i].length) {
				return false;
			}
		}
	}
	else {
		for (int i = instructionIndex - 1; i >= labelIndex && i > 0; i--) {
			if (!instructions[i].length) {
				return false;
			}
			if (i == 0)
				return true;
		}
	}
	return true;
}